

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O0

void __thiscall
gmlc::containers::
StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
::StableBlockVector(StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
                    *this)

{
  StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
  *this_local;
  
  this->csize = 0;
  this->dataptr = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0;
  this->dataSlotsAvailable = 0;
  this->dataSlotIndex = 0;
  this->bsize = 0x20;
  this->freeSlotsAvailable = 0;
  this->freeIndex = 0;
  this->freeblocks = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0;
  return;
}

Assistant:

StableBlockVector() noexcept {}